

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O0

ssize_t __thiscall HPack::BitOStream::write(BitOStream *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  long in_FS_OFFSET;
  quint32 fullPrefix;
  quint8 prefixLen;
  value_type_conflict3 *in_stack_ffffffffffffffc8;
  quint8 bitLength;
  uchar bits;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = 8 - ((byte)this->bitsSet & 7);
  uVar4 = CONCAT13(bVar2,in_stack_ffffffffffffffe0);
  uVar3 = (1 << (bVar2 & 0x1f)) - 1;
  bitLength = (quint8)(uVar3 >> 0x10);
  bits = (uchar)(uVar3 >> 0x18);
  if ((uint)__fd < uVar3) {
    writeBits((BitOStream *)CONCAT44(__fd,uVar4),bits,bitLength);
  }
  else {
    writeBits((BitOStream *)CONCAT44(__fd,uVar4),bits,bitLength);
    for (uVar3 = __fd - uVar3; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
                 in_stack_ffffffffffffffc8);
      this->bitsSet = this->bitsSet + 8;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               in_stack_ffffffffffffffc8);
    this->bitsSet = this->bitsSet + 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void BitOStream::write(quint32 src)
{
    const quint8 prefixLen = 8 - bitsSet % 8;
    const quint32 fullPrefix = (1 << prefixLen) - 1;

    // https://http2.github.io/http2-spec/compression.html#low-level.representation,
    // 5.1
    if (src < fullPrefix) {
        writeBits(uchar(src), prefixLen);
    } else {
        writeBits(uchar(fullPrefix), prefixLen);
        // We're on the byte boundary now,
        // so we can just 'push_back'.
        Q_ASSERT(!(bitsSet % 8));
        src -= fullPrefix;
        while (src >= 128) {
            buffer.push_back(uchar(src % 128 + 128));
            src /= 128;
            bitsSet += 8;
        }
        buffer.push_back(src);
        bitsSet += 8;
    }
}